

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int init_blocksize(vorb *f,int b,int n)

{
  float *pfVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  uint16 *puVar5;
  uint uVar6;
  int n8;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar10 = n * 2 & 0xfffffffc;
  pfVar3 = (float *)setup_malloc(f,uVar10);
  f->A[(uint)b] = pfVar3;
  pfVar3 = (float *)setup_malloc(f,uVar10);
  f->B[(uint)b] = pfVar3;
  pfVar4 = (float *)setup_malloc(f,n & 0xfffffffc);
  f->C[(uint)b] = pfVar4;
  pfVar3 = f->A[(uint)b];
  if ((pfVar3 != (float *)0x0) &&
     (pfVar1 = f->B[(uint)b], pfVar4 != (float *)0x0 && pfVar1 != (float *)0x0)) {
    uVar6 = n >> 2;
    uVar2 = n >> 3;
    dVar14 = (double)n;
    if (0 < (int)uVar6) {
      lVar7 = 1;
      iVar11 = 0;
      uVar8 = uVar6;
      do {
        dVar12 = ((double)iVar11 * 3.141592653589793) / dVar14;
        dVar13 = cos(dVar12);
        pfVar3[lVar7 + -1] = (float)dVar13;
        dVar12 = sin(dVar12);
        pfVar3[lVar7] = -(float)dVar12;
        dVar12 = (((double)(int)lVar7 * 3.141592653589793) / dVar14) * 0.5;
        dVar13 = cos(dVar12);
        pfVar1[lVar7 + -1] = (float)dVar13 * 0.5;
        dVar12 = sin(dVar12);
        pfVar1[lVar7] = (float)dVar12 * 0.5;
        lVar7 = lVar7 + 2;
        iVar11 = iVar11 + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    if (0 < (int)uVar2) {
      lVar7 = 2;
      uVar8 = uVar2;
      do {
        dVar12 = ((double)(int)lVar7 * 3.141592653589793) / dVar14;
        dVar13 = cos(dVar12);
        *(float *)((long)pfVar4 + lVar7 * 2 + -4) = (float)dVar13;
        dVar12 = sin(dVar12);
        *(float *)((long)pfVar4 + lVar7 * 2) = -(float)dVar12;
        lVar7 = lVar7 + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    pfVar3 = (float *)setup_malloc(f,uVar10);
    f->window[(uint)b] = pfVar3;
    if (pfVar3 != (float *)0x0) {
      uVar10 = n >> 1;
      if (0 < (int)uVar10) {
        uVar9 = 0;
        do {
          dVar14 = sin((((double)(int)uVar9 + 0.5) / (double)(int)uVar10) * 0.5 * 3.141592653589793)
          ;
          dVar14 = sin((double)((float)dVar14 * (float)dVar14) * 1.5707963267948966);
          pfVar3[uVar9] = (float)dVar14;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      puVar5 = (uint16 *)setup_malloc(f,uVar6 & 0xfffffffe);
      f->bit_reverse[(uint)b] = puVar5;
      if (puVar5 != (uint16 *)0x0) {
        if ((int)uVar2 < 1) {
          return 1;
        }
        iVar11 = ilog(n);
        uVar9 = 0;
        do {
          uVar10 = (uint)uVar9;
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          uVar10 = (uVar10 & 0xf0f0f0f) << 4 | uVar10 >> 4 & 0xf0f0f0f;
          uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333) * 4;
          puVar5[uVar9] =
               (uint16)(((uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555) * 2 >>
                        (0x24U - (char)iVar11 & 0x1f)) << 2);
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        return 1;
      }
    }
  }
  f->error = VORBIS_outofmem;
  return 0;
}

Assistant:

static int init_blocksize(vorb *f, int b, int n)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3;
   f->A[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->B[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->C[b] = (float *) setup_malloc(f, sizeof(float) * n4);
   if (!f->A[b] || !f->B[b] || !f->C[b]) return error(f, VORBIS_outofmem);
   compute_twiddle_factors(n, f->A[b], f->B[b], f->C[b]);
   f->window[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   if (!f->window[b]) return error(f, VORBIS_outofmem);
   compute_window(n, f->window[b]);
   f->bit_reverse[b] = (uint16 *) setup_malloc(f, sizeof(uint16) * n8);
   if (!f->bit_reverse[b]) return error(f, VORBIS_outofmem);
   compute_bitreverse(n, f->bit_reverse[b]);
   return TRUE;
}